

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

void ssdp_read(SOCKET *rsock,fd_set *set)

{
  int iVar1;
  int ret;
  fd_set *set_local;
  SOCKET *rsock_local;
  
  if (((*rsock != -1) &&
      ((set->__fds_bits[*rsock / 0x40] & 1L << ((byte)((long)*rsock % 0x40) & 0x3f)) != 0)) &&
     (iVar1 = readFromSSDPSocket(*rsock), iVar1 != 0)) {
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x224,
               "miniserver: Error in readFromSSDPSocket(%d): closing socket\n",(ulong)(uint)*rsock);
    sock_close(*rsock);
    *rsock = -1;
  }
  return;
}

Assistant:

static void ssdp_read(SOCKET *rsock, fd_set *set)
{
	if (*rsock != INVALID_SOCKET && FD_ISSET(*rsock, set)) {
		int ret = readFromSSDPSocket(*rsock);
		if (ret != 0) {
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"miniserver: Error in readFromSSDPSocket(%d): "
				"closing socket\n",
				*rsock);
			sock_close(*rsock);
			*rsock = INVALID_SOCKET;
		}
	}
}